

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Options::AbortOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,AbortOptionParser *this)

{
  allocator<char> local_19;
  AbortOptionParser *local_18;
  AbortOptionParser *this_local;
  
  local_18 = this;
  this_local = (AbortOptionParser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "If a REQUIRE assertion fails the test case aborts, but subsequent test cases are still run. If a CHECK assertion fails even the current test case is not aborted.\n\nSometimes this results in a flood of failure messages and you\'d rather just see the first few. Specifying -a or --abort on its own will abort the whole test run on the first failed assertion of any kind. Following it with a number causes it to abort after that number of assertion failures."
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "If a REQUIRE assertion fails the test case aborts, but subsequent test cases "
                    "are still run. If a CHECK assertion fails even the current test case is not "
                    "aborted.\n"
                    "\n"
                    "Sometimes this results in a flood of failure messages and you'd rather just "
                    "see the first few. Specifying -a or --abort on its own will abort the whole "
                    "test run on the first failed assertion of any kind. Following it with a "
                    "number causes it to abort after that number of assertion failures.";
            }